

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtRuntime.cpp
# Opt level: O2

void JsrtRuntime::RecyclerCollectCallbackStatic(void *context,RecyclerCollectCallBackFlags flags)

{
  undefined1 local_20 [8];
  JsrtCallbackState scope;
  
  if ((flags & Collect_Begin) == 0) {
    if ((flags & Collect_Begin_Sweep) == 0) {
      return;
    }
    if (*(long *)((long)context + 0x28) == 0) {
      return;
    }
    JsrtCallbackState::JsrtCallbackState((JsrtCallbackState *)local_20,*context);
    (**(code **)((long)context + 0x28))(*(undefined8 *)((long)context + 0x30));
  }
  else {
    if (*(long *)((long)context + 0x20) == 0) {
      return;
    }
    JsrtCallbackState::JsrtCallbackState((JsrtCallbackState *)local_20,*context);
    (**(code **)((long)context + 0x20))(*(undefined8 *)((long)context + 0x58));
  }
  JsrtCallbackState::~JsrtCallbackState((JsrtCallbackState *)local_20);
  return;
}

Assistant:

void JsrtRuntime::RecyclerCollectCallbackStatic(void * context, RecyclerCollectCallBackFlags flags)
{
    if (flags & Collect_Begin)
    {
        JsrtRuntime * _this = reinterpret_cast<JsrtRuntime *>(context);
        if (_this->beforeCollectCallback == nullptr) 
        {
            return;
        }
        try
        {
            JsrtCallbackState scope(reinterpret_cast<ThreadContext*>(_this->GetThreadContext()));
            _this->beforeCollectCallback(_this->beforeCollectCallbackContext);
        }
        catch (...)
        {
            AssertMsg(false, "Unexpected non-engine exception.");
        }
    }
#ifdef _CHAKRACOREBUILD
    else if (flags & Collect_Begin_Sweep)
    {
        JsrtRuntime * _this = reinterpret_cast<JsrtRuntime *>(context);
        if (_this->beforeSweepCallback == nullptr)
        {
            return;
        }
        try
        {
            JsrtCallbackState scope(reinterpret_cast<ThreadContext*>(_this->GetThreadContext()));
            _this->beforeSweepCallback(_this->beforeSweepCallbackContext);
        }
        catch (...)
        {
            AssertMsg(false, "Unexpected non-engine exception.");
        }
    }
#endif
}